

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequence.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QKeySequence *keysequence)

{
  QKeySequencePrivate *pQVar1;
  undefined8 uVar2;
  char cVar3;
  ulong uVar4;
  QKeySequencePrivate *pQVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  long in_FS_OFFSET;
  quint32 c;
  quint32 keys [4];
  uint local_4c;
  int local_48 [6];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_4c);
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (local_4c != 0) {
    piVar8 = local_48;
    uVar7 = 0;
    do {
      cVar3 = QDataStream::atEnd();
      if (cVar3 != '\0') {
        operator>>();
        goto LAB_00598b81;
      }
      QDataStream::operator>>(s,piVar8);
      uVar7 = uVar7 + 1;
      uVar4 = (ulong)local_4c;
      if (3 < local_4c) {
        uVar4 = 4;
      }
      piVar8 = piVar8 + 1;
    } while (uVar7 < uVar4);
  }
  pQVar1 = keysequence->d;
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1) {
    pQVar5 = (QKeySequencePrivate *)operator_new(0x14);
    (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    uVar2 = *(undefined8 *)(pQVar1->key + 2);
    *(undefined8 *)pQVar5->key = *(undefined8 *)pQVar1->key;
    *(undefined8 *)(pQVar5->key + 2) = uVar2;
    keysequence->d = pQVar5;
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar1,0x14);
    }
  }
  pQVar1 = keysequence->d;
  uVar7 = 5;
  lVar6 = 0;
  do {
    *(undefined4 *)((long)pQVar1->key + lVar6) = *(undefined4 *)((long)local_48 + lVar6);
    uVar7 = uVar7 - 1;
    lVar6 = lVar6 + 4;
  } while (1 < uVar7);
LAB_00598b81:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QKeySequence &keysequence)
{
    const quint32 MaxKeys = QKeySequencePrivate::MaxKeyCount;
    quint32 c;
    s >> c;
    quint32 keys[MaxKeys] = {0};
    for (uint i = 0; i < qMin(c, MaxKeys); ++i) {
        if (s.atEnd()) {
            qWarning("Premature EOF while reading QKeySequence");
            return s;
        }
        s >> keys[i];
    }
    qAtomicDetach(keysequence.d);
    std::copy(keys, keys + MaxKeys, QT_MAKE_CHECKED_ARRAY_ITERATOR(keysequence.d->key, MaxKeys));
    return s;
}